

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcArbitraryProfileDefWithVoids,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcArbitraryClosedProfileDef *this;
  
  this = (IfcArbitraryClosedProfileDef *)operator_new(0xb0);
  *(undefined ***)
   &this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x10 = &PTR__Object_00816a50;
  *(undefined8 *)
   &this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x18 = 0;
  *(char **)&this[1].super_IfcProfileDef.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20 =
       "IfcArbitraryProfileDefWithVoids";
  Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef::IfcArbitraryClosedProfileDef
            (this,&PTR_construction_vtable_24__00865a90);
  *(undefined8 *)&this->field_0x78 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcArbitraryProfileDefWithVoids_00865a00;
  *(undefined ***)
   &this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
    field_0x10 = &PTR__IfcArbitraryProfileDefWithVoids_00865a78;
  *(undefined ***)&(this->super_IfcProfileDef).field_0x58 =
       &PTR__IfcArbitraryProfileDefWithVoids_00865a28;
  *(undefined ***)&this->field_0x70 = &PTR__IfcArbitraryProfileDefWithVoids_00865a50;
  *(undefined8 *)&this->field_0x80 = 0;
  this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x0;
  this[1].super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(this->super_IfcProfileDef).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }